

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# HandleManager.cpp
# Opt level: O0

LocalFederateId __thiscall
helics::HandleManager::getLocalFedID(HandleManager *this,InterfaceHandle handle)

{
  bool bVar1;
  const_reference pvVar2;
  deque<helics::BasicHandleInfo,_std::allocator<helics::BasicHandleInfo>_> *in_RDI;
  BaseType index;
  deque<helics::BasicHandleInfo,_std::allocator<helics::BasicHandleInfo>_>
  *in_stack_ffffffffffffffd8;
  InterfaceHandle local_8;
  LocalFederateId local_4;
  
  InterfaceHandle::baseValue(&local_8);
  bVar1 = isValidIndex<int,std::deque<helics::BasicHandleInfo,std::allocator<helics::BasicHandleInfo>>>
                    ((int)((ulong)in_RDI >> 0x20),in_stack_ffffffffffffffd8);
  if (bVar1) {
    pvVar2 = std::deque<helics::BasicHandleInfo,_std::allocator<helics::BasicHandleInfo>_>::
             operator[](in_RDI,(size_type)in_stack_ffffffffffffffd8);
    local_4.fid = (pvVar2->local_fed_id).fid;
  }
  else {
    memset(&local_4,0,4);
    LocalFederateId::LocalFederateId(&local_4);
  }
  return (LocalFederateId)local_4.fid;
}

Assistant:

LocalFederateId HandleManager::getLocalFedID(InterfaceHandle handle) const
{
    auto index = handle.baseValue();
    return (isValidIndex(index, handles)) ? handles[index].local_fed_id : LocalFederateId{};
}